

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPN::OPN(OPN *this)

{
  Channel4 *this_00;
  long lVar1;
  
  OPNBase::OPNBase(&this->super_OPNBase);
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_00213de0;
  lVar1 = 0x1d8;
  do {
    Channel4::Channel4((Channel4 *)((this->super_OPNBase).super_Timer.regta + lVar1 + -10));
    lVar1 = lVar1 + 0x2e0;
  } while (lVar1 != 0xa78);
  (this->super_OPNBase).fmvolume = 0x4000;
  PSG::SetVolume(&(this->super_OPNBase).psg,0);
  (this->super_OPNBase).csmch = (Channel4 *)&this->field_0x798;
  for (lVar1 = 0x1d8; lVar1 != 0xa78; lVar1 = lVar1 + 0x2e0) {
    this_00 = (Channel4 *)((this->super_OPNBase).super_Timer.regta + lVar1 + -10);
    Channel4::SetChip(this_00,&(this->super_OPNBase).chip);
    Channel4::SetType(this_00,typeN);
  }
  return;
}

Assistant:

OPN::OPN()
{
	SetVolumeFM(0);
	SetVolumePSG(0);

	csmch = &ch[2];

	for (int i=0; i<3; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}